

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O2

int mbedtls_ecdh_read_public(mbedtls_ecdh_context *ctx,uchar *buf,size_t blen)

{
  int iVar1;
  uchar *p;
  uchar *local_18;
  
  if (ctx == (mbedtls_ecdh_context *)0x0) {
    iVar1 = -0x4f80;
  }
  else {
    local_18 = buf;
    iVar1 = mbedtls_ecp_tls_read_point(&ctx->grp,&ctx->Qp,&local_18,blen);
    if ((iVar1 == 0) && (iVar1 = -0x4f80, (long)local_18 - (long)buf == blen)) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecdh_read_public( mbedtls_ecdh_context *ctx,
                      const unsigned char *buf, size_t blen )
{
    int ret;
    const unsigned char *p = buf;

    if( ctx == NULL )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    if( ( ret = mbedtls_ecp_tls_read_point( &ctx->grp, &ctx->Qp, &p, blen ) ) != 0 )
        return( ret );

    if( (size_t)( p - buf ) != blen )
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

    return( 0 );
}